

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall
CS248::DynamicScene::XFormWidget::draw_pick(XFormWidget *this,int *pickID,bool transformed)

{
  map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
  *this_00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this_01;
  Mode MVar1;
  int iVar2;
  value_type_conflict3 *__val;
  mapped_type *pmVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Ccolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Zcolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Ycolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> Xcolor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if ((this->target).object != (SceneObject *)0x0) {
    this_00 = &this->pickIDToAxis;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID;
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_48);
    *pmVar3 = X;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID + 1;
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_48);
    *pmVar3 = Y;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = *pickID + 2;
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_48);
    *pmVar3 = Z;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_48.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,*pickID + 3);
    pmVar3 = std::
             map<int,_CS248::DynamicScene::Selection::Axis,_std::less<int>,_std::allocator<std::pair<const_int,_CS248::DynamicScene::Selection::Axis>_>_>
             ::operator[](this_00,(key_type_conflict *)&local_48);
    *pmVar3 = Center;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 4;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 4;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 4;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(4);
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 4;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    iVar2 = *pickID;
    *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar2;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar2 >> 8);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar2 >> 0x10);
    iVar2 = *pickID + 1;
    *local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar2;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar2 >> 8);
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar2 >> 0x10);
    iVar2 = *pickID + 2;
    *local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar2;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar2 >> 8);
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar2 >> 0x10);
    iVar2 = *pickID + 3;
    *local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (uchar)iVar2;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (uchar)((uint)iVar2 >> 8);
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = (uchar)((uint)iVar2 >> 0x10);
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '@';
    this_01 = &this->axisColors;
    local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::resize(this_01,4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&local_48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,&local_68);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 2,&local_88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((this_01->
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 3,&local_a8);
    glPushMatrix();
    MVar1 = this->mode;
    if (MVar1 == Translate) {
      drawTranslateHandles(this);
    }
    else if (MVar1 == Rotate) {
      drawRotateHandles(this);
    }
    else if (MVar1 == Scale) {
      drawScaleHandles(this);
    }
    glPopMatrix();
    *pickID = *pickID + 4;
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void XFormWidget::draw_pick(int& pickID, bool transformed) {
  if (target.object == nullptr) return;

  pickIDToAxis[pickID + 0] = Selection::Axis::X;
  pickIDToAxis[pickID + 1] = Selection::Axis::Y;
  pickIDToAxis[pickID + 2] = Selection::Axis::Z;
  pickIDToAxis[pickID + 3] = Selection::Axis::Center;

  vector<GLubyte> Xcolor(4), Ycolor(4), Zcolor(4), Ccolor(4);
  IndexToRGB(pickID + 0, Xcolor[0], Xcolor[1], Xcolor[2]);
  IndexToRGB(pickID + 1, Ycolor[0], Ycolor[1], Ycolor[2]);
  IndexToRGB(pickID + 2, Zcolor[0], Zcolor[1], Zcolor[2]);
  IndexToRGB(pickID + 3, Ccolor[0], Ccolor[1], Ccolor[2]);
  Xcolor[3] = Ycolor[3] = Zcolor[3] = Ccolor[3] = 64;

  axisColors.resize(4);
  axisColors[0] = Xcolor;
  axisColors[1] = Ycolor;
  axisColors[2] = Zcolor;
  axisColors[3] = Ccolor;

  glPushMatrix();

  switch (mode) {
    case Mode::Translate:
      drawTranslateHandles();
      break;
    case Mode::Rotate:
      drawRotateHandles();
      break;
    case Mode::Scale:
      drawScaleHandles();
      break;
    default:
      break;
  }
  glPopMatrix();

  pickID += 4;
}